

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

FieldSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,uint *args_2,uint *args_3)

{
  uint uVar1;
  uint32_t uVar2;
  string_view name;
  FieldSymbol *this_00;
  
  this_00 = (FieldSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FieldSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (FieldSymbol *)allocateSlow(this,0x168,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  uVar1 = *args_2;
  uVar2 = *args_3;
  ast::VariableSymbol::VariableSymbol(&this_00->super_VariableSymbol,Field,name,*args_1,Automatic);
  this_00->bitOffset = (ulong)uVar1;
  this_00->fieldIndex = uVar2;
  this_00->randMode = None;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }